

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined8 *puVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  uint uVar7;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m256i *ptr;
  __m256i *palVar20;
  __m256i *ptr_00;
  int64_t *ptr_01;
  ulong uVar21;
  __m256i *palVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  char *__format;
  ulong uVar33;
  __m256i *__return_storage_ptr__;
  long lVar34;
  ulong uVar35;
  long lVar36;
  undefined8 uVar37;
  ulong size;
  long lVar38;
  long lVar39;
  int iVar40;
  bool bVar41;
  long lVar42;
  undefined1 auVar43 [16];
  undefined8 uVar49;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined8 uVar48;
  undefined8 uVar50;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar51 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffd40 [20];
  undefined4 in_stack_fffffffffffffd60;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined1 local_1e0 [32];
  longlong local_a0 [4];
  ulong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "profile";
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar27 = "profile->profile64.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar27 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar27 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar27 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar27 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar27 = "open";
        }
        else {
          if (-1 < gap) {
            uVar15 = uVar3 - 1;
            size = (ulong)uVar3 + 3 >> 2;
            uVar6 = (ulong)uVar15 % size;
            iVar17 = (int)(uVar15 / size);
            uVar26 = CONCAT44(0,open);
            iVar40 = -open;
            iVar25 = ppVar5->min;
            uVar32 = 0x8000000000000000 - (long)iVar25;
            if (iVar25 != iVar40 && SBORROW4(iVar25,iVar40) == iVar25 + open < 0) {
              uVar32 = uVar26 | 0x8000000000000000;
            }
            iVar25 = ppVar5->max;
            ppVar19 = parasail_result_new();
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x4800802;
              ptr = parasail_memalign___m256i(0x20,size);
              palVar20 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              uVar23 = (ulong)(s2Len + 1);
              __return_storage_ptr__ = (__m256i *)0x20;
              ptr_01 = parasail_memalign_int64_t(0x20,uVar23);
              if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (palVar20 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
                iVar16 = s2Len + -1;
                iVar24 = 3 - iVar17;
                uVar21 = CONCAT44(0,gap);
                auVar44._8_4_ = gap;
                auVar44._0_8_ = uVar21;
                auVar44._12_4_ = 0;
                auVar44._16_4_ = gap;
                auVar44._20_4_ = 0;
                auVar44._24_4_ = gap;
                auVar44._28_4_ = 0;
                lVar38 = uVar32 + 1;
                lVar28 = 0x7ffffffffffffffe - (long)iVar25;
                uVar31 = (ulong)iVar40;
                uVar32 = uVar31;
                for (uVar29 = 0; uVar29 != size; uVar29 = uVar29 + 1) {
                  uVar33 = uVar32;
                  for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
                    uVar35 = uVar33;
                    if (s1_beg != 0) {
                      uVar35 = 0;
                    }
                    local_80[lVar34] = uVar35;
                    local_a0[lVar34] = uVar35 - uVar26;
                    uVar33 = uVar33 - size * uVar21;
                  }
                  __return_storage_ptr__ = (__m256i *)(uVar29 * 0x20);
                  palVar22 = ptr + uVar29;
                  (*palVar22)[0] = local_80[0];
                  (*palVar22)[1] = local_80[1];
                  (*palVar22)[2] = local_80[2];
                  (*palVar22)[3] = local_80[3];
                  palVar22 = ptr_00 + uVar29;
                  (*palVar22)[0] = local_a0[0];
                  (*palVar22)[1] = local_a0[1];
                  (*palVar22)[2] = local_a0[2];
                  (*palVar22)[3] = local_a0[3];
                  uVar32 = uVar32 - uVar21;
                }
                *ptr_01 = 0;
                for (uVar32 = 1; uVar23 != uVar32; uVar32 = uVar32 + 1) {
                  iVar25 = 0;
                  if (s2_beg == 0) {
                    iVar25 = iVar40;
                  }
                  ptr_01[uVar32] = (long)iVar25;
                  iVar40 = iVar40 - gap;
                }
                uVar7 = (uint)size;
                lVar34 = size * 0x20 + 0x20;
                uVar32 = 0;
                local_1e0._8_8_ = lVar38;
                local_1e0._0_8_ = lVar38;
                local_1e0._16_8_ = lVar38;
                local_1e0._24_8_ = lVar38;
                auVar47 = ZEXT3264(local_1e0);
                iVar25 = iVar16;
                lVar36 = lVar38;
                lStack_1f8 = lVar28;
                lStack_1f0 = lVar28;
                lStack_1e8 = lVar28;
                lVar42 = lVar28;
                do {
                  palVar22 = palVar20;
                  if (uVar32 == (uint)s2Len) {
                    if (s2_end != 0) {
                      for (iVar17 = 0; iVar17 < iVar24; iVar17 = iVar17 + 1) {
                        auVar46 = auVar47._0_32_;
                        auVar44 = vperm2i128_avx2(auVar46,auVar46,8);
                        auVar44 = vpalignr_avx2(auVar46,auVar44,8);
                        auVar47 = ZEXT3264(auVar44);
                      }
                      lVar36 = vpextrq_avx(auVar47._16_16_,1);
                    }
                    uVar18 = uVar15;
                    if (s1_end != 0) {
                      for (uVar32 = 0; (uVar7 & 0x1fffffff) << 2 != (uint)uVar32;
                          uVar32 = uVar32 + 1) {
                        uVar30 = ((uint)uVar32 & 3) * uVar7 + ((uint)(uVar32 >> 2) & 0x3fffffff);
                        lVar34 = lVar36;
                        uVar14 = uVar18;
                        iVar17 = iVar16;
                        if (((int)uVar30 < (int)uVar3) &&
                           (lVar34 = (*ptr)[uVar32], uVar14 = uVar30, iVar17 = iVar25,
                           lVar34 <= lVar36)) {
                          if ((int)uVar18 <= (int)uVar30) {
                            uVar30 = uVar18;
                          }
                          if (iVar16 != iVar25) {
                            uVar30 = uVar18;
                          }
                          bVar41 = lVar34 == lVar36;
                          lVar34 = lVar36;
                          uVar14 = uVar18;
                          iVar17 = iVar16;
                          if (bVar41) {
                            uVar14 = uVar30;
                          }
                        }
                        uVar18 = uVar14;
                        lVar36 = lVar34;
                        iVar16 = iVar17;
                      }
                    }
                    iVar17 = (int)lVar36;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar2 = ptr[uVar6];
                      for (iVar17 = 0; iVar17 < iVar24; iVar17 = iVar17 + 1) {
                        auVar44 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                  8);
                        alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar44,8);
                      }
                      uVar37 = vpextrq_avx(alVar2._16_16_,1);
                      iVar17 = (int)uVar37;
                      uVar18 = uVar15;
                      iVar16 = iVar25;
                    }
                    auVar10._8_8_ = lVar38;
                    auVar10._0_8_ = lVar38;
                    auVar10._16_8_ = lVar38;
                    auVar10._24_8_ = lVar38;
                    auVar9._8_8_ = lStack_1f8;
                    auVar9._0_8_ = lVar42;
                    auVar9._16_8_ = lStack_1f0;
                    auVar9._24_8_ = lStack_1e8;
                    auVar44 = vpcmpgtq_avx2(auVar10,auVar9);
                    auVar11._8_8_ = lVar28;
                    auVar11._0_8_ = lVar28;
                    auVar11._16_8_ = lVar28;
                    auVar11._24_8_ = lVar28;
                    auVar46 = vpcmpgtq_avx2(local_1e0,auVar11);
                    auVar44 = vpor_avx2(auVar46,auVar44);
                    if ((((auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar44 >> 0x7f,0) != '\0') || SUB321(auVar44 >> 0xbf,0) != '\0') ||
                        auVar44[0x1f] < '\0') {
                      *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                      iVar17 = 0;
                      iVar16 = 0;
                      uVar18 = 0;
                    }
                    ppVar19->score = iVar17;
                    ppVar19->end_query = uVar18;
                    ppVar19->end_ref = iVar16;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(palVar22);
                    parasail_free(ptr);
                    return ppVar19;
                  }
                  auVar45 = auVar47._0_32_;
                  alVar2 = ptr[uVar7 - 1];
                  auVar43 = alVar2._0_16_;
                  auVar46._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar43;
                  auVar46._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar43;
                  auVar46 = vpalignr_avx2((undefined1  [32])alVar2,auVar46,8);
                  iVar40 = ppVar5->mapper[(byte)s2[uVar32]];
                  auVar46 = vpblendd_avx2(auVar46,ZEXT832((ulong)ptr_01[uVar32]),3);
                  auVar51._8_8_ = lVar38;
                  auVar51._0_8_ = lVar38;
                  auVar51._16_8_ = lVar38;
                  auVar51._24_8_ = lVar38;
                  for (lVar39 = 0; size * 0x20 != lVar39; lVar39 = lVar39 + 0x20) {
                    auVar46 = vpaddq_avx2(auVar46,*(undefined1 (*) [32])
                                                   ((long)pvVar4 +
                                                   lVar39 + (long)(int)(iVar40 * uVar7) * 0x20));
                    auVar8 = *(undefined1 (*) [32])((long)*ptr_00 + lVar39);
                    alVar2[2]._4_4_ = iVar16;
                    alVar2._0_20_ = in_stack_fffffffffffffd40;
                    alVar2[3] = (longlong)ptr;
                    b[0]._4_4_ = iVar25;
                    b[0]._0_4_ = in_stack_fffffffffffffd60;
                    b[1] = (longlong)ptr_01;
                    b[2] = lVar36;
                    b[3] = lVar34;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,alVar2,b);
                    a[2]._4_4_ = iVar16;
                    a._0_20_ = in_stack_fffffffffffffd40;
                    a[3] = (longlong)ptr;
                    b_00[0]._4_4_ = iVar25;
                    b_00[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_00[1] = (longlong)ptr_01;
                    b_00[2] = lVar36;
                    b_00[3] = lVar34;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                    *(undefined1 (*) [32])((long)*palVar22 + lVar39) = auVar46;
                    a_00[2]._4_4_ = iVar16;
                    a_00._0_20_ = in_stack_fffffffffffffd40;
                    a_00[3] = (longlong)ptr;
                    b_01[0]._4_4_ = iVar25;
                    b_01[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_01[1] = (longlong)ptr_01;
                    b_01[2] = lVar36;
                    b_01[3] = lVar34;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                    a_01[2]._4_4_ = iVar16;
                    a_01._0_20_ = in_stack_fffffffffffffd40;
                    a_01[3] = (longlong)ptr;
                    b_02[0]._4_4_ = iVar25;
                    b_02[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_02[1] = (longlong)ptr_01;
                    b_02[2] = lVar36;
                    b_02[3] = lVar34;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                    a_02[2]._4_4_ = iVar16;
                    a_02._0_20_ = in_stack_fffffffffffffd40;
                    a_02[3] = (longlong)ptr;
                    b_03[0]._4_4_ = iVar25;
                    b_03[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_03[1] = (longlong)ptr_01;
                    b_03[2] = lVar36;
                    b_03[3] = lVar34;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                    a_03[2]._4_4_ = iVar16;
                    a_03._0_20_ = in_stack_fffffffffffffd40;
                    a_03[3] = (longlong)ptr;
                    b_04[0]._4_4_ = iVar25;
                    b_04[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_04[1] = (longlong)ptr_01;
                    b_04[2] = lVar36;
                    b_04[3] = lVar34;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                    auVar12._8_4_ = open;
                    auVar12._0_8_ = uVar26;
                    auVar12._12_4_ = 0;
                    auVar12._16_4_ = open;
                    auVar12._20_4_ = 0;
                    auVar12._24_4_ = open;
                    auVar12._28_4_ = 0;
                    vpsubq_avx2(auVar46,auVar12);
                    auVar46 = vpsubq_avx2(auVar8,auVar44);
                    a_04[2]._4_4_ = iVar16;
                    a_04._0_20_ = in_stack_fffffffffffffd40;
                    a_04[3] = (longlong)ptr;
                    b_05[0]._4_4_ = iVar25;
                    b_05[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_05[1] = (longlong)ptr_01;
                    b_05[2] = lVar36;
                    b_05[3] = lVar34;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar39) = auVar46;
                    auVar51 = vpsubq_avx2(auVar51,auVar44);
                    a_05[2]._4_4_ = iVar16;
                    a_05._0_20_ = in_stack_fffffffffffffd40;
                    a_05[3] = (longlong)ptr;
                    b_06[0]._4_4_ = iVar25;
                    b_06[0]._0_4_ = in_stack_fffffffffffffd60;
                    b_06[1] = (longlong)ptr_01;
                    b_06[2] = lVar36;
                    b_06[3] = lVar34;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                    auVar46 = *(undefined1 (*) [32])((long)*ptr + lVar39);
                  }
                  for (iVar40 = 0; iVar40 != 4; iVar40 = iVar40 + 1) {
                    uVar23 = uVar31;
                    if (s2_beg == 0) {
                      uVar23 = ptr_01[uVar32 + 1] - uVar26;
                    }
                    auVar46 = vpermq_avx2(auVar51,0x90);
                    auVar51 = vpblendd_avx2(auVar46,ZEXT832(uVar23),3);
                    lVar39 = 0;
                    while (lVar34 != lVar39 + 0x20) {
                      puVar1 = (undefined8 *)((long)*palVar22 + lVar39);
                      uVar37 = *puVar1;
                      uVar48 = puVar1[1];
                      uVar49 = puVar1[2];
                      uVar50 = puVar1[3];
                      a_06[2]._4_4_ = iVar16;
                      a_06._0_20_ = in_stack_fffffffffffffd40;
                      a_06[3] = (longlong)ptr;
                      b_07[0]._4_4_ = iVar25;
                      b_07[0]._0_4_ = in_stack_fffffffffffffd60;
                      b_07[1] = (longlong)ptr_01;
                      b_07[2] = lVar36;
                      b_07[3] = lVar34;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                      puVar1 = (undefined8 *)((long)*palVar22 + lVar39);
                      *puVar1 = uVar37;
                      puVar1[1] = uVar48;
                      puVar1[2] = uVar49;
                      puVar1[3] = uVar50;
                      a_07[2]._4_4_ = iVar16;
                      a_07._0_20_ = in_stack_fffffffffffffd40;
                      a_07[3] = (longlong)ptr;
                      b_08[0]._4_4_ = iVar25;
                      b_08[0]._0_4_ = in_stack_fffffffffffffd60;
                      b_08[1] = (longlong)ptr_01;
                      b_08[2] = lVar36;
                      b_08[3] = lVar34;
                      _mm256_min_epi64_rpl(__return_storage_ptr__,a_07,b_08);
                      a_08[2]._4_4_ = iVar16;
                      a_08._0_20_ = in_stack_fffffffffffffd40;
                      a_08[3] = (longlong)ptr;
                      b_09[0]._4_4_ = iVar25;
                      b_09[0]._0_4_ = in_stack_fffffffffffffd60;
                      b_09[1] = (longlong)ptr_01;
                      b_09[2] = lVar36;
                      b_09[3] = lVar34;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_09);
                      auVar8._8_8_ = uVar48;
                      auVar8._0_8_ = uVar37;
                      auVar8._16_8_ = uVar49;
                      auVar8._24_8_ = uVar50;
                      auVar13._8_4_ = open;
                      auVar13._0_8_ = uVar26;
                      auVar13._12_4_ = 0;
                      auVar13._16_4_ = open;
                      auVar13._20_4_ = 0;
                      auVar13._24_4_ = open;
                      auVar13._28_4_ = 0;
                      auVar46 = vpsubq_avx2(auVar8,auVar13);
                      auVar51 = vpsubq_avx2(auVar51,auVar44);
                      auVar46 = vpcmpgtq_avx2(auVar51,auVar46);
                      lVar39 = lVar39 + 0x20;
                      if ((((auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar46 >> 0x7f,0) == '\0') && SUB321(auVar46 >> 0xbf,0) == '\0')
                          && -1 < auVar46[0x1f]) goto LAB_00718c8e;
                    }
                  }
LAB_00718c8e:
                  auVar47 = ZEXT3264((undefined1  [32])palVar22[uVar6]);
                  auVar46 = vpcmpgtq_avx2((undefined1  [32])palVar22[uVar6],auVar45);
                  a_09[2]._4_4_ = iVar16;
                  a_09._0_20_ = in_stack_fffffffffffffd40;
                  a_09[3] = (longlong)ptr;
                  b_10[0]._4_4_ = iVar25;
                  b_10[0]._0_4_ = in_stack_fffffffffffffd60;
                  b_10[1] = (longlong)ptr_01;
                  b_10[2] = lVar36;
                  b_10[3] = lVar34;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_10);
                  auVar45._8_8_ = -(ulong)(iVar24 == 2);
                  auVar45._0_8_ = -(ulong)(iVar24 == 3);
                  auVar45._16_8_ = -(ulong)(iVar24 == 1);
                  auVar45._24_8_ = -(ulong)(iVar17 == 3);
                  auVar45 = auVar45 & auVar46;
                  if ((((auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar45 >> 0x7f,0) != '\0') || SUB321(auVar45 >> 0xbf,0) != '\0') ||
                      auVar45[0x1f] < '\0') {
                    iVar16 = (int)uVar32;
                  }
                  uVar32 = uVar32 + 1;
                  palVar20 = ptr;
                  ptr = palVar22;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar27 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_striped_profile_avx2_256_64",pcVar27);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}